

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O3

RETURN_TYPE __thiscall
duckdb::DBConfig::GetSetting<duckdb::CatalogErrorMaxSchemasSetting>
          (DBConfig *this,ClientContext *context)

{
  int iVar1;
  uint64_t uVar2;
  Value local_50;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    CatalogErrorMaxSchemasSetting::GetSetting(&local_50,context);
    uVar2 = Value::GetValue<unsigned_long>(&local_50);
    Value::~Value(&local_50);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return uVar2;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

typename OP::RETURN_TYPE GetSetting(const ClientContext &context) {
		std::lock_guard<mutex> lock(config_lock);
		return OP::GetSetting(context).template GetValue<typename OP::RETURN_TYPE>();
	}